

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cpp
# Opt level: O0

void flatbuffers::tests::anon_unknown_2::NumericUtilsTestInteger<unsigned_long>
               (char *lower,char *upper)

{
  bool bVar1;
  unsigned_long val;
  unsigned_long uVar2;
  unsigned_long expval;
  unsigned_long x;
  char *upper_local;
  char *lower_local;
  
  x = (unsigned_long)upper;
  upper_local = lower;
  bVar1 = StringToNumber<unsigned_long>("1q",&expval);
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(\"1q\", &x)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0xd,"");
  TestEq<unsigned_long,int>
            (expval,0,"\'x\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
             ,0xe,"");
  bVar1 = StringToNumber<unsigned_long>((char *)x,&expval);
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(upper, &x)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0xf,"");
  uVar2 = expval;
  val = std::numeric_limits<unsigned_long>::max();
  TestEq<unsigned_long,unsigned_long>
            (uVar2,val,"\'x\' != \'flatbuffers::numeric_limits<T>::max()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
             ,0x10,"");
  bVar1 = StringToNumber<unsigned_long>(upper_local,&expval);
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(lower, &x)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x11,"");
  uVar2 = std::numeric_limits<unsigned_long>::max();
  TestEq<unsigned_long,unsigned_long>
            (expval,uVar2,"\'x\' != \'expval\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
             ,0x15,"");
  return;
}

Assistant:

void NumericUtilsTestInteger(const char *lower, const char *upper) {
  T x;
  TEST_EQ(flatbuffers::StringToNumber("1q", &x), false);
  TEST_EQ(x, 0);
  TEST_EQ(flatbuffers::StringToNumber(upper, &x), false);
  TEST_EQ(x, flatbuffers::numeric_limits<T>::max());
  TEST_EQ(flatbuffers::StringToNumber(lower, &x), false);
  auto expval = flatbuffers::is_unsigned<T>::value
                    ? flatbuffers::numeric_limits<T>::max()
                    : flatbuffers::numeric_limits<T>::lowest();
  TEST_EQ(x, expval);
}